

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.cpp
# Opt level: O1

void __thiscall QueryResult::do_or(QueryResult *this,QueryResult *other,QueryCounter *counter)

{
  QueryOperation op;
  QueryOperation local_58;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  void *pvStack_30;
  undefined8 local_28;
  long lStack_20;
  
  local_58.parent = counter;
  local_58.start_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  if ((this->has_everything == false) && (other->has_everything != true)) {
    SortedRun::do_or(&this->results,&other->results);
  }
  else {
    this->has_everything = true;
    local_28 = 0;
    lStack_20 = 0;
    local_38 = 0;
    pvStack_30 = (void *)0x0;
    local_48 = (void *)0x0;
    uStack_40 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(this->results).run_,&pvStack_30);
    if (pvStack_30 != (void *)0x0) {
      operator_delete(pvStack_30,lStack_20 - (long)pvStack_30);
    }
    if (local_48 != (void *)0x0) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
  }
  QueryOperation::~QueryOperation(&local_58);
  return;
}

Assistant:

void QueryResult::do_or(QueryResult &&other, QueryCounter *counter) {
    auto op = QueryOperation(counter);
    if (this->is_everything() || other.is_everything()) {
        has_everything = true;
        results = std::move(SortedRun());
    } else {
        results.do_or(other.results);
    }
}